

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O0

int Wlc_PrsReadDeclaration(Wlc_Prs_t *p,char *pStart)

{
  Wlc_Ntk_t *p_00;
  int iVar1;
  Wlc_Obj_t *pWVar2;
  Wlc_Obj_t *pObj;
  int TypeNew;
  int XValue;
  char *pName;
  int local_48;
  int fIsPo;
  int NameId;
  int End;
  int Beg;
  int Signed;
  char *pLine;
  int local_28;
  int iObj;
  int Type;
  int fFound;
  char *pStart_local;
  Wlc_Prs_t *p_local;
  
  iObj = 0;
  local_28 = 0;
  End = 0;
  NameId = 0;
  fIsPo = 0;
  pName._4_4_ = 0;
  _Type = pStart;
  pStart_local = (char *)p;
  iVar1 = Wlc_PrsStrCmp(pStart,"input");
  if (iVar1 == 0) {
    iVar1 = Wlc_PrsStrCmp(_Type,"output");
    if (iVar1 != 0) {
      _Type = _Type + 6;
      pName._4_4_ = 1;
    }
  }
  else {
    _Type = _Type + 5;
    local_28 = 1;
  }
  _Type = Wlc_PrsSkipSpaces(_Type);
  iVar1 = Wlc_PrsStrCmp(_Type,"wire");
  if (iVar1 == 0) {
    iVar1 = Wlc_PrsStrCmp(_Type,"reg");
    if (iVar1 != 0) {
      _Type = _Type + 3;
    }
  }
  else {
    _Type = _Type + 4;
  }
  _Beg = Wlc_PrsFindWord(_Type,"signed",&End);
  _Type = _Beg;
  _Type = Wlc_PrsFindRange(_Beg,&fIsPo,&NameId);
  if (_Type == (char *)0x0) {
    p_local._4_4_ = Wlc_PrsWriteErrorMessage((Wlc_Prs_t *)pStart_local,_Beg,"Non-standard range.");
  }
  else {
    if (((fIsPo != 0) && (NameId != 0)) &&
       (iVar1 = *(int *)(pStart_local + 0x54), *(int *)(pStart_local + 0x54) = iVar1 + 1, iVar1 == 0
       )) {
      *(int *)(pStart_local + 0x58) = fIsPo;
      *(int *)(pStart_local + 0x5c) = NameId;
      iVar1 = Wlc_PrsFindLine((Wlc_Prs_t *)pStart_local,_Type);
      *(int *)(pStart_local + 0x60) = iVar1;
    }
    if (((fIsPo < 0) || (NameId < 0)) &&
       (iVar1 = *(int *)(pStart_local + 100), *(int *)(pStart_local + 100) = iVar1 + 1, iVar1 == 0))
    {
      *(int *)(pStart_local + 0x68) = fIsPo;
      *(int *)(pStart_local + 0x6c) = NameId;
      iVar1 = Wlc_PrsFindLine((Wlc_Prs_t *)pStart_local,_Type);
      *(int *)(pStart_local + 0x70) = iVar1;
    }
    if ((fIsPo < NameId) &&
       (iVar1 = *(int *)(pStart_local + 0x74), *(int *)(pStart_local + 0x74) = iVar1 + 1, iVar1 == 0
       )) {
      *(int *)(pStart_local + 0x78) = fIsPo;
      *(int *)(pStart_local + 0x7c) = NameId;
      iVar1 = Wlc_PrsFindLine((Wlc_Prs_t *)pStart_local,_Type);
      *(int *)(pStart_local + 0x80) = iVar1;
    }
    while (_Type = Wlc_PrsFindName(_Type,(char **)&TypeNew), _Type != (char *)0x0) {
      local_48 = Abc_NamStrFindOrAdd(*(Abc_Nam_t **)(*(long *)(pStart_local + 0x30) + 0x2b0),
                                     _TypeNew,&iObj);
      if (iObj != 0) {
        iVar1 = Wlc_PrsWriteErrorMessage
                          ((Wlc_Prs_t *)pStart_local,_Type,"Name %s is declared more than once.",
                           _TypeNew);
        return iVar1;
      }
      pLine._4_4_ = Wlc_ObjAlloc(*(Wlc_Ntk_t **)(pStart_local + 0x30),local_28,End,fIsPo,NameId);
      if (pName._4_4_ != 0) {
        p_00 = *(Wlc_Ntk_t **)(pStart_local + 0x30);
        pWVar2 = Wlc_NtkObj(*(Wlc_Ntk_t **)(pStart_local + 0x30),pLine._4_4_);
        Wlc_ObjSetCo(p_00,pWVar2,0);
      }
      if (pLine._4_4_ != local_48) {
        __assert_fail("iObj == NameId",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcReadVer.c"
                      ,0x3a5,"int Wlc_PrsReadDeclaration(Wlc_Prs_t *, char *)");
      }
      _Type = Wlc_PrsSkipSpaces(_Type);
      if (*_Type != ',') {
        pObj._0_4_ = Wlc_PrsFindDefinition
                               ((Wlc_Prs_t *)pStart_local,_Type,*(Vec_Int_t **)(pStart_local + 0x28)
                                ,(int *)((long)&pObj + 4));
        if ((int)pObj != 0) {
          pWVar2 = Wlc_NtkObj(*(Wlc_Ntk_t **)(pStart_local + 0x30),pLine._4_4_);
          Wlc_ObjUpdateType(*(Wlc_Ntk_t **)(pStart_local + 0x30),pWVar2,(int)pObj);
          Wlc_ObjAddFanins(*(Wlc_Ntk_t **)(pStart_local + 0x30),pWVar2,
                           *(Vec_Int_t **)(pStart_local + 0x28));
          *(ushort *)pWVar2 = *(ushort *)pWVar2 & 0xf7ff | (pObj._4_2_ & 1) << 0xb;
        }
        return 1;
      }
      _Type = _Type + 1;
    }
    p_local._4_4_ =
         Wlc_PrsWriteErrorMessage
                   ((Wlc_Prs_t *)pStart_local,(char *)0x0,"Cannot read name in declaration.");
  }
  return p_local._4_4_;
}

Assistant:

int Wlc_PrsReadDeclaration( Wlc_Prs_t * p, char * pStart )
{
    int fFound = 0, Type = WLC_OBJ_NONE, iObj; char * pLine;
    int Signed = 0, Beg = 0, End = 0, NameId, fIsPo = 0;
    if ( Wlc_PrsStrCmp( pStart, "input" ) )
        pStart += strlen("input"), Type = WLC_OBJ_PI;
    else if ( Wlc_PrsStrCmp( pStart, "output" ) )
        pStart += strlen("output"), fIsPo = 1;
    pStart = Wlc_PrsSkipSpaces( pStart );
    if ( Wlc_PrsStrCmp( pStart, "wire" ) )
        pStart += strlen("wire");
    else if ( Wlc_PrsStrCmp( pStart, "reg" ) )
        pStart += strlen("reg");
    // read 'signed'
    pStart = Wlc_PrsFindWord( pStart, "signed", &Signed );
    // read range
    pLine = pStart;
    pStart = Wlc_PrsFindRange( pStart, &End, &Beg );
    if ( pStart == NULL )
        return Wlc_PrsWriteErrorMessage( p, pLine, "Non-standard range." );
    if ( End != 0 && Beg != 0 )
    {
        if ( p->nNonZero[0]++ == 0 )
        {
            p->nNonZero[1] = End;
            p->nNonZero[2] = Beg;
            p->nNonZero[3] = Wlc_PrsFindLine(p, pStart);
        }
    }
    if ( End < 0 || Beg < 0  )
    {
        if ( p->nNegative[0]++ == 0 )
        {
            p->nNegative[1] = End;
            p->nNegative[2] = Beg;
            p->nNegative[3] = Wlc_PrsFindLine(p, pStart);
        }
    }
    if ( End < Beg )
    {
        if ( p->nReverse[0]++ == 0 )
        {
            p->nReverse[1] = End;
            p->nReverse[2] = Beg;
            p->nReverse[3] = Wlc_PrsFindLine(p, pStart);
        }
    }
    while ( 1 )
    {
        char * pName; int XValue, TypeNew;
        // read name
        pStart = Wlc_PrsFindName( pStart, &pName );
        if ( pStart == NULL )
            return Wlc_PrsWriteErrorMessage( p, pStart, "Cannot read name in declaration." );
        NameId = Abc_NamStrFindOrAdd( p->pNtk->pManName, pName, &fFound );
        if ( fFound )
            return Wlc_PrsWriteErrorMessage( p, pStart, "Name %s is declared more than once.", pName );
        iObj = Wlc_ObjAlloc( p->pNtk, Type, Signed, End, Beg );
        if ( fIsPo ) Wlc_ObjSetCo( p->pNtk, Wlc_NtkObj(p->pNtk, iObj), 0 );
        assert( iObj == NameId );
        // check next definition
        pStart = Wlc_PrsSkipSpaces( pStart );
        if ( pStart[0] == ',' )
        {
            pStart++;
            continue;
        }
        // check definition
        TypeNew = Wlc_PrsFindDefinition( p, pStart, p->vFanins, &XValue );
        if ( TypeNew )
        {
            Wlc_Obj_t * pObj = Wlc_NtkObj( p->pNtk, iObj );
            Wlc_ObjUpdateType( p->pNtk, pObj, TypeNew );
            Wlc_ObjAddFanins( p->pNtk, pObj, p->vFanins );
            pObj->fXConst = XValue;
        }
        break;
    }
    return 1;
}